

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

error_info *
toml::detail::make_not_found_error<toml::type_config>
          (error_info *__return_storage_ptr__,basic_value<toml::type_config> *v,string *fname,
          key_type *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  pointer pcVar5;
  size_type __n;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  undefined8 uVar10;
  region_type *r;
  long *plVar11;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  locs;
  string title;
  source_location loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  size_type *local_218;
  size_type local_210;
  size_type local_208;
  undefined8 uStack_200;
  long *local_1f8;
  size_type local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  undefined8 uStack_1e0;
  long *local_1d8;
  size_type local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  undefined8 uStack_1c0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  char *local_180;
  size_type local_178;
  char local_170;
  undefined7 uStack_16f;
  undefined8 uStack_168;
  char *local_160;
  size_type local_158;
  char local_150;
  undefined7 uStack_14f;
  undefined8 uStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [120];
  source_location local_a8;
  
  r = &v->region_;
  source_location::source_location(&local_a8,r);
  paVar3 = &local_258.field_2;
  pcVar4 = (fname->_M_dataplus)._M_p;
  local_258._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar4,pcVar4 + fname->_M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_258,": key \"");
  pcVar4 = (key->_M_dataplus)._M_p;
  local_238 = &local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar4,pcVar4 + key->_M_string_length);
  __n = local_230;
  local_140.field_2._M_allocated_capacity =
       CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]);
  local_140._M_dataplus._M_p = (pointer)local_238;
  paVar8 = &local_228;
  if (local_238 == &local_228) {
    local_140.field_2._8_8_ = local_228._8_8_;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    paVar8 = local_238;
  }
  local_238 = paVar8;
  local_228._M_local_buf[0] = '\0';
  local_230 = 0;
  uVar2 = local_258._M_string_length + __n;
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar3) {
    uVar10 = local_258.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < uVar2) {
    uVar6 = local_140.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == &local_140.field_2) {
      uVar6 = 0xf;
    }
    if (uVar2 <= uVar6) {
      pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_140,0,0,local_258._M_dataplus._M_p,local_258._M_string_length);
      goto LAB_00253a54;
    }
  }
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_258,local_140._M_dataplus._M_p,__n);
LAB_00253a54:
  local_120._0_8_ = local_120 + 0x10;
  pcVar5 = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar8) {
    local_120._16_8_ = paVar8->_M_allocated_capacity;
    local_120._24_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_120._16_8_ = paVar8->_M_allocated_capacity;
    local_120._0_8_ = pcVar5;
  }
  local_120._8_8_ = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                  "\" not found");
  local_218 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218 == paVar8) {
    local_208 = paVar8->_M_allocated_capacity;
    uStack_200 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_218 = &local_208;
  }
  else {
    local_208 = paVar8->_M_allocated_capacity;
  }
  local_210 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,
                    CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar3) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity = 0;
  if (local_a8.is_ok_ == false) {
    plVar11 = (long *)&local_1c8;
    local_1d8 = plVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,local_218,(pointer)(local_210 + (long)local_218));
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_198,
             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_258);
    local_160 = &local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
    paVar1 = &(__return_storage_ptr__->title_).field_2;
    (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_1d8 == plVar11) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_1c7,local_1c8);
      *(undefined8 *)((long)&(__return_storage_ptr__->title_).field_2 + 8) = uStack_1c0;
    }
    else {
      (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)local_1d8;
      (__return_storage_ptr__->title_).field_2._M_allocated_capacity =
           CONCAT71(uStack_1c7,local_1c8);
    }
    (__return_storage_ptr__->title_)._M_string_length = local_1d0;
    local_1d0 = 0;
    local_1c8 = 0;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_198.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_198.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_198.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_198.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_198.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar1 = &(__return_storage_ptr__->suffix_).field_2;
    (__return_storage_ptr__->suffix_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_160 == &local_150) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_14f,local_150);
      *(undefined8 *)((long)&(__return_storage_ptr__->suffix_).field_2 + 8) = uStack_148;
    }
    else {
      (__return_storage_ptr__->suffix_)._M_dataplus._M_p = local_160;
      (__return_storage_ptr__->suffix_).field_2._M_allocated_capacity =
           CONCAT71(uStack_14f,local_150);
    }
    (__return_storage_ptr__->suffix_)._M_string_length = local_158;
    local_158 = 0;
    local_150 = '\0';
    local_1d8 = plVar11;
    local_160 = &local_150;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_198);
    plVar9 = local_1d8;
  }
  else {
    if (((local_a8.first_line_ == 1) && (local_a8.first_column_ == 1)) && (local_a8.length_ == 1)) {
      source_location::source_location((source_location *)local_120,r);
      std::
      vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
      ::emplace_back<toml::source_location,char_const(&)[23]>
                ((vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
                  *)&local_258,(source_location *)local_120,(char (*) [23])"at the top-level table")
      ;
    }
    else {
      source_location::source_location((source_location *)local_120,r);
      std::
      vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
      ::emplace_back<toml::source_location,char_const(&)[14]>
                ((vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
                  *)&local_258,(source_location *)local_120,(char (*) [14])"in this table");
    }
    source_location::~source_location((source_location *)local_120);
    plVar11 = (long *)&local_1e8;
    local_1f8 = plVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_218,(pointer)(local_210 + (long)local_218));
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_1b8,
             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_258);
    local_180 = &local_170;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
    paVar1 = &(__return_storage_ptr__->title_).field_2;
    (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_1f8 == plVar11) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_1e7,local_1e8);
      *(undefined8 *)((long)&(__return_storage_ptr__->title_).field_2 + 8) = uStack_1e0;
    }
    else {
      (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)local_1f8;
      (__return_storage_ptr__->title_).field_2._M_allocated_capacity =
           CONCAT71(uStack_1e7,local_1e8);
    }
    (__return_storage_ptr__->title_)._M_string_length = local_1f0;
    local_1f0 = 0;
    local_1e8 = 0;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1b8.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1b8.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1b8.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar1 = &(__return_storage_ptr__->suffix_).field_2;
    (__return_storage_ptr__->suffix_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_180 == &local_170) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_16f,local_170);
      *(undefined8 *)((long)&(__return_storage_ptr__->suffix_).field_2 + 8) = uStack_168;
    }
    else {
      (__return_storage_ptr__->suffix_)._M_dataplus._M_p = local_180;
      (__return_storage_ptr__->suffix_).field_2._M_allocated_capacity =
           CONCAT71(uStack_16f,local_170);
    }
    (__return_storage_ptr__->suffix_)._M_string_length = local_178;
    local_178 = 0;
    local_170 = '\0';
    local_1f8 = plVar11;
    local_180 = &local_170;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1b8);
    plVar9 = local_1f8;
  }
  if (plVar9 != plVar11) {
    operator_delete(plVar9,*plVar11 + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_258);
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  source_location::~source_location(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

error_info make_not_found_error(const basic_value<TC>& v, const std::string& fname, const typename basic_value<TC>::key_type& key)
{
    const auto loc = v.location();
    const std::string title = fname + ": key \"" + string_conv<std::string>(key) + "\" not found";

    std::vector<std::pair<source_location, std::string>> locs;
    if( ! loc.is_ok())
    {
        return error_info(title, locs);
    }

    if(loc.first_line_number() == 1 && loc.first_column_number() == 1 && loc.length() == 1)
    {
        // The top-level table has its region at the 0th character of the file.
        // That means that, in the case when a key is not found in the top-level
        // table, the error message points to the first character. If the file has
        // the first table at the first line, the error message would be like this.
        // ```console
        // [error] key "a" not found
        //  --> example.toml
        //    |
        //  1 | [table]
        //    | ^------ in this table
        // ```
        // It actually points to the top-level table at the first character, not
        // `[table]`. But it is too confusing. To avoid the confusion, the error
        // message should explicitly say "key not found in the top-level table".
        locs.emplace_back(v.location(), "at the top-level table");
    }
    else
    {
        locs.emplace_back(v.location(), "in this table");
    }
    return error_info(title, locs);
}